

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnndomain * rnn_finddomain(rnndb *db,char *name)

{
  rnndomain *prVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)db->domainsnum;
  if (db->domainsnum < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      return (rnndomain *)0x0;
    }
    prVar1 = db->domains[uVar4];
    iVar2 = strcmp(prVar1->name,name);
    uVar4 = uVar4 + 1;
  } while (iVar2 != 0);
  return prVar1;
}

Assistant:

struct rnndomain *rnn_finddomain (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->domainsnum; i++)
		if (!strcmp(db->domains[i]->name, name))
			return db->domains[i];
	return 0;
}